

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::WhileLoopStatement::evalImpl(WhileLoopStatement *this,EvalContext *context)

{
  bool bVar1;
  ER result;
  ConstantValue cv;
  EvalContext *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ER in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 local_50;
  undefined4 local_4;
  
  do {
    Expression::eval((Expression *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (EvalContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    bVar1 = slang::ConstantValue::bad((ConstantValue *)0xbf9082);
    if (bVar1) {
      local_4 = Fail;
      local_50 = 1;
    }
    else {
      bVar1 = slang::ConstantValue::isTrue
                        ((ConstantValue *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      in_stack_ffffffffffffff8c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff8c);
      if (bVar1) {
        in_stack_ffffffffffffff88 =
             Statement::eval((Statement *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
        if (in_stack_ffffffffffffff88 == Success) {
LAB_00bf9144:
          local_50 = 0;
        }
        else if (in_stack_ffffffffffffff88 == Break) {
          local_50 = 3;
        }
        else {
          if (in_stack_ffffffffffffff88 == Continue) goto LAB_00bf9144;
          local_50 = 1;
          local_4 = in_stack_ffffffffffffff88;
        }
      }
      else {
        local_50 = 3;
      }
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xbf9156);
    if (local_50 != 0) {
      if (local_50 != 1) {
        local_4 = Success;
      }
      return local_4;
    }
    in_stack_ffffffffffffff84 = 0;
  } while( true );
}

Assistant:

ER WhileLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        auto cv = cond.eval(context);
        if (cv.bad())
            return ER::Fail;

        if (!cv.isTrue())
            break;

        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}